

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::UngroupedDistinctAggregateFinalizeEvent::Schedule
          (UngroupedDistinctAggregateFinalizeEvent *this)

{
  size_type __n;
  Executor *args;
  bool bVar1;
  int32_t val;
  type this_00;
  const_reference this_01;
  pointer this_02;
  mapped_type *pmVar2;
  reference this_03;
  ClientContext *context;
  pointer pDVar3;
  reference this_04;
  type sink_p;
  idx_t iVar4;
  TaskScheduler *this_05;
  unsigned_long uVar5;
  Pipeline *pPVar6;
  pointer this_06;
  pointer this_07;
  long lVar7;
  ulong uVar8;
  PhysicalUngroupedAggregate *pPVar9;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> tasks;
  long *local_b0;
  undefined1 local_a8 [16];
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_98;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  type local_68;
  PhysicalUngroupedAggregate *local_60;
  enable_shared_from_this<duckdb::Event> local_58;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  pPVar9 = this->op;
  this_07 = (pointer)&pPVar9->aggregates;
  this_00 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
            ::operator*(&pPVar9->distinct_data);
  this_06 = (pointer)&this->global_source_states;
  local_80 = (pointer)&this_00->radix_tables;
  lVar7 = 0;
  local_78 = this_06;
  local_70 = this_07;
  local_68 = this_00;
  local_60 = pPVar9;
  for (local_98.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start <
      (pointer)((long)(pPVar9->aggregates).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pPVar9->aggregates).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3);
      local_98.
      super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)&((local_98.
                              super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->internal).
                            super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1)
      ) {
    this_01 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::get<true>((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)this_07,
                          (size_type)
                          local_98.
                          super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    this_02 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(this_01);
    BaseExpression::Cast<duckdb::BoundAggregateExpression>(&this_02->super_BaseExpression);
    bVar1 = DistinctAggregateData::IsDistinct
                      (this_00,(idx_t)local_98.
                                      super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
    if (bVar1) {
      pmVar2 = ::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this_00->info->table_map,(key_type *)&local_98);
      __n = *pmVar2;
      this_03 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                ::get<true>((vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                             *)local_80,__n);
      context = (ClientContext *)
                unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                ::operator*(this_03);
      pDVar3 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
               ::operator->(&this->gstate->distinct_state);
      this_04 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                ::get<true>(&pDVar3->radix_states,__n);
      sink_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
               ::operator*(this_04);
      iVar4 = RadixPartitionedHashTable::MaxThreads((RadixPartitionedHashTable *)context,sink_p);
      this_06 = local_78;
      RadixPartitionedHashTable::GetGlobalSourceState((RadixPartitionedHashTable *)local_a8,context)
      ;
      ::std::
      vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
                  *)this_06,
                 (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                  *)local_a8);
      if ((_Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
           )local_a8._0_8_ != (GlobalSourceState *)0x0) {
        (**(code **)(*(long *)local_a8._0_8_ + 8))();
      }
      lVar7 = lVar7 + iVar4;
      this_00 = local_68;
      this_07 = local_70;
      pPVar9 = local_60;
    }
    else {
      local_a8._0_8_ =
           (__uniq_ptr_data<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true,_true>
            )0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>
                ((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
                  *)this_06,
                 (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                  *)local_a8);
      if ((GlobalSourceState *)local_a8._0_8_ != (GlobalSourceState *)0x0) {
        (**(code **)(*(long *)&((_Rep_type *)local_a8._0_8_)->_M_impl + 8))();
      }
    }
  }
  uVar8 = lVar7 + (ulong)(lVar7 == 0);
  this_05 = TaskScheduler::GetScheduler(this->context);
  val = TaskScheduler::NumberOfThreads(this_05);
  uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  if (uVar5 <= uVar8) {
    uVar8 = uVar5;
  }
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78 = (pointer)&(this->super_BasePipelineEvent).pipeline;
  local_80 = (pointer)&(this->super_BasePipelineEvent).super_Event.
                       super_enable_shared_from_this<duckdb::Event>;
  while (bVar1 = uVar8 != 0, uVar8 = uVar8 - 1, bVar1) {
    pPVar6 = shared_ptr<duckdb::Pipeline,_true>::operator->
                       ((shared_ptr<duckdb::Pipeline,_true> *)local_78);
    args = pPVar6->executor;
    enable_shared_from_this<duckdb::Event>::shared_from_this(&local_58);
    make_uniq<duckdb::UngroupedDistinctAggregateFinalizeTask,duckdb::Executor&,duckdb::shared_ptr<duckdb::Event,true>,duckdb::PhysicalUngroupedAggregate_const&,duckdb::UngroupedAggregateGlobalSinkState&>
              ((duckdb *)&local_b0,args,(shared_ptr<duckdb::Event,_true> *)&local_58,this->op,
               this->gstate);
    shared_ptr<duckdb::Task,_true>::
    shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeTask,_std::default_delete<duckdb::UngroupedDistinctAggregateFinalizeTask>,_true,_0>
              ((shared_ptr<duckdb::Task,_true> *)local_a8,
               (unique_ptr<duckdb::UngroupedDistinctAggregateFinalizeTask,_std::default_delete<duckdb::UngroupedDistinctAggregateFinalizeTask>,_true>
                *)&local_b0);
    ::std::
    vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
    ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
              ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                *)&local_98,(shared_ptr<duckdb::Task,_true> *)local_a8);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
    if (local_b0 != (long *)0x0) {
      (**(code **)(*local_b0 + 8))();
    }
    local_b0 = (long *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_58.__weak_this_.internal.
                super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    this->tasks_scheduled = this->tasks_scheduled + 1;
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_98.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_98.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_98.
       super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Event::SetTasks((Event *)this,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void UngroupedDistinctAggregateFinalizeEvent::Schedule() {
	D_ASSERT(gstate.distinct_state);
	auto &aggregates = op.aggregates;
	auto &distinct_data = *op.distinct_data;

	idx_t n_tasks = 0;
	idx_t payload_idx = 0;
	idx_t next_payload_idx = 0;
	for (idx_t agg_idx = 0; agg_idx < aggregates.size(); agg_idx++) {
		auto &aggregate = aggregates[agg_idx]->Cast<BoundAggregateExpression>();

		// Forward the payload idx
		payload_idx = next_payload_idx;
		next_payload_idx = payload_idx + aggregate.children.size();

		// If aggregate is not distinct, skip it
		if (!distinct_data.IsDistinct(agg_idx)) {
			global_source_states.push_back(nullptr);
			continue;
		}
		D_ASSERT(distinct_data.info.table_map.count(agg_idx));

		// Create global state for scanning
		auto table_idx = distinct_data.info.table_map.at(agg_idx);
		auto &radix_table_p = *distinct_data.radix_tables[table_idx];
		n_tasks += radix_table_p.MaxThreads(*gstate.distinct_state->radix_states[table_idx]);
		global_source_states.push_back(radix_table_p.GetGlobalSourceState(context));
	}
	n_tasks = MaxValue<idx_t>(n_tasks, 1);
	n_tasks = MinValue<idx_t>(n_tasks, NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads()));

	vector<shared_ptr<Task>> tasks;
	for (idx_t i = 0; i < n_tasks; i++) {
		tasks.push_back(
		    make_uniq<UngroupedDistinctAggregateFinalizeTask>(pipeline->executor, shared_from_this(), op, gstate));
		tasks_scheduled++;
	}
	SetTasks(std::move(tasks));
}